

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coveragetocsv.cpp
# Opt level: O0

void coveragetocsv::doit(bool skipheader)

{
  size_t local_20;
  size_t i;
  float local_10;
  int id;
  OASIS_FLOAT tiv;
  bool skipheader_local;
  
  id._3_1_ = skipheader;
  if (!skipheader) {
    printf("coverage_id,tiv\n");
  }
  i._4_4_ = 0;
  local_20 = fread(&local_10,4,1,_stdin);
  while (local_20 != 0) {
    i._4_4_ = i._4_4_ + 1;
    printf("%d, %f\n",(double)local_10,(ulong)i._4_4_);
    local_20 = fread(&local_10,4,1,_stdin);
  }
  return;
}

Assistant:

void doit(bool skipheader)
	{

		if(skipheader == false) printf("coverage_id,tiv\n");
		
		OASIS_FLOAT tiv;
		int id = 0;
		size_t i = fread(&tiv, sizeof(tiv), 1, stdin);
		while (i != 0) {
			id++;
			printf("%d, %f\n", id, tiv);
			i = fread(&tiv, sizeof(tiv), 1, stdin);
		}
	}